

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkers.cpp
# Opt level: O3

void snap_to_black_proc(Am_Object *inter,Am_Object *ref_obj,int x,int y,int *out_x,int *out_y)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  undefined4 extraout_var;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  Am_Object piece;
  Am_Object piece_state;
  Am_Object board;
  Am_Object window;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  uint local_50;
  uint local_4c;
  Am_Object local_48;
  Am_Object local_40;
  undefined8 local_38;
  
  local_50 = y;
  local_4c = x;
  Am_Object::Get_Object((ushort)&local_68,(ulong)inter);
  local_40.data = (Am_Object_Data *)0x0;
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_68,0x68);
  Am_Object::operator=(&local_40,pAVar6);
  Am_Object::Get_Object((ushort)&local_48,(ulong)&local_40);
  Am_Object::Set((ushort)&local_68,SUB21(MOVED,0),0);
  Am_Object::Set((ushort)&local_68,SUB21(JUMPED,0),0);
  *out_x = local_4c;
  *out_y = local_50;
  Am_Translate_Coordinates(ref_obj,local_4c,local_50,&local_48,(int *)&local_4c,(int *)&local_50);
  if (399 < local_50 || 399 < local_4c) goto LAB_00104387;
  uVar11 = (local_50 + 0x19 & 0xffff) / 0x32;
  uVar10 = (local_4c + 0x19 & 0xffff) / 0x32;
  if ((((uVar11 ^ uVar10) & 1) == 0) ||
     (Board[(local_4c + 0x19 & 0xffff) / 100 + uVar11 * 4].piece != 0)) goto LAB_00104387;
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_68,(ulong)BLACK_PLAYER);
  bVar2 = Am_Value::operator_cast_to_bool(pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_68,0x85);
  Am_Value::operator_cast_to_int(pAVar6);
  local_58.data = (Am_Object_Data *)0x0;
  if (bVar2) {
    Am_Object::Get_Object((ushort)&local_60,0x10c320);
    Am_Object::operator=(&local_58,&local_60);
  }
  else {
    Am_Object::Get_Object((ushort)&local_60,0x10c318);
    Am_Object::operator=(&local_58,&local_60);
  }
  Am_Object::~Am_Object(&local_60);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_58,(ulong)ROW);
  iVar4 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_58,(ulong)COLUMN);
  iVar5 = Am_Value::operator_cast_to_int(pAVar6);
  local_38 = CONCAT44(extraout_var,iVar5);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_58,(ulong)KINGED);
  bVar3 = Am_Value::operator_cast_to_bool(pAVar6);
  if (bVar3) {
LAB_00104232:
    uVar7 = iVar4 - uVar11;
    uVar1 = -uVar7;
    if (0 < (int)uVar7) {
      uVar1 = uVar7;
    }
    iVar5 = (int)local_38;
    uVar8 = iVar5 - uVar10;
    uVar7 = -uVar8;
    if (0 < (int)uVar8) {
      uVar7 = uVar8;
    }
    if ((uVar1 < 3) && (uVar1 == uVar7)) {
      if (uVar1 == 2) {
        iVar9 = iVar5 + uVar10 + 3;
        if (-1 < (int)(iVar5 + uVar10)) {
          iVar9 = iVar5 + uVar10;
        }
        iVar4 = (iVar9 >> 2) + ((iVar4 + uVar11) - ((int)(iVar4 + uVar11) >> 0x1f) & 0xfffffffe) * 2
        ;
        if ((Board[iVar4].piece == 0) || (Board[iVar4].black == bVar2)) goto LAB_0010437d;
        Am_Object::Set((ushort)&local_68,SUB21(JUMPED,0),1);
      }
      else if (uVar1 == 1) {
        pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_68,(ulong)LAST_JUMPED);
        bVar2 = Am_Value::operator_cast_to_bool(pAVar6);
        if (bVar2) goto LAB_0010437d;
      }
      *out_x = uVar10 * 0x32;
      *out_y = uVar11 * 0x32;
      Am_Translate_Coordinates(&local_48,*out_x,uVar11 * 0x32,ref_obj,out_x,out_y);
      Am_Object::Set((ushort)&local_68,SUB21(MOVED,0),1);
      Am_Object::Set((ushort)&local_68,(uint)ROW,(ulong)uVar11);
      Am_Object::Set((ushort)&local_68,(uint)COLUMN,(ulong)uVar10);
    }
  }
  else if (bVar2) {
    if (iVar4 < (int)uVar11) goto LAB_00104232;
  }
  else if ((int)uVar11 < iVar4) goto LAB_00104232;
LAB_0010437d:
  Am_Object::~Am_Object(&local_58);
LAB_00104387:
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_68);
  return;
}

Assistant:

Am_Define_Method(Am_Custom_Gridding_Method, void, snap_to_black,
                 (Am_Object inter, const Am_Object &ref_obj, int x, int y,
                  int &out_x, int &out_y))
{
  Am_Object piece = inter.Get_Owner();
  Am_Object window;
  window = piece.Get(Am_WINDOW);
  Am_Object board = window.Get_Object(BOARD);
  piece.Set(MOVED, false);
  piece.Set(JUMPED, false);
  out_x = x;
  out_y = y;
  Am_Translate_Coordinates(ref_obj, x, y, board, x, y);
  if ((x < 0) || (y < 0) || (x >= 400) || (y >= 400))
    return;
  int row, col;
  row = (y + 25) / 50;
  col = (x + 25) / 50;
  if ((row % 2) == (col % 2))
    return;
  if (Board[(row * 4) + (col / 2)].piece)
    return;
  bool black_player = piece.Get(BLACK_PLAYER);
  int rank = piece.Get(Am_RANK);
  Am_Object piece_state;
  if (black_player)
    piece_state = Black_Pieces.Get_Object(piece_slot[rank]);
  else
    piece_state = Red_Pieces.Get_Object(piece_slot[rank]);
  int piece_row = piece_state.Get(ROW);
  int piece_col = piece_state.Get(COLUMN);
  if (!(bool)piece_state.Get(KINGED)) {
    if (black_player) {
      if (row <= piece_row)
        return;
    } else {
      if (row >= piece_row)
        return;
    }
  }
  int row_diff = DIFF(piece_row, row);
  int col_diff = DIFF(piece_col, col);
  if ((row_diff != col_diff) || (row_diff > 2))
    return;
  if ((row_diff == 1) && (bool)piece.Get(LAST_JUMPED))
    return;
  if (row_diff == 2) {
    int jump_row = (row + piece_row) / 2;
    int jump_col = (col + piece_col) / 2;
    int jump_index = (jump_row * 4) + (jump_col / 2);
    if (!Board[jump_index].piece || (Board[jump_index].black == black_player))
      return;
    piece.Set(JUMPED, true);
  }
  out_x = col * 50 /* + (int)inter.Get (Am_X_OFFSET)*/;
  out_y = row * 50 /* + (int)inter.Get (Am_Y_OFFSET)*/;
  Am_Translate_Coordinates(board, out_x, out_y, ref_obj, out_x, out_y);
  piece.Set(MOVED, true);
  piece.Set(ROW, row);
  piece.Set(COLUMN, col);
}